

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O0

double __thiscall agg::bspline::get(bspline *this,double x)

{
  size_t __size;
  __compar_fn_t in_R8;
  int local_24;
  double dStack_20;
  int i;
  double x_local;
  bspline *this_local;
  
  if (this->m_num < 3) {
    this_local = (bspline *)0x0;
  }
  else {
    dStack_20 = x;
    x_local = (double)this;
    if (*this->m_x <= x) {
      __size = (size_t)(this->m_num + -1);
      if (x < this->m_x[__size]) {
        bsearch((void *)(ulong)(uint)this->m_num,this->m_x,(size_t)&local_24,__size,in_R8);
        this_local = (bspline *)interpolation(this,dStack_20,local_24);
      }
      else {
        this_local = (bspline *)extrapolation_right(this,x);
      }
    }
    else {
      this_local = (bspline *)extrapolation_left(this,x);
    }
  }
  return (double)this_local;
}

Assistant:

double bspline::get(double x) const
    {
        if(m_num > 2)
        {
            int i;

            // Extrapolation on the left
            if(x < m_x[0]) return extrapolation_left(x);

            // Extrapolation on the right
            if(x >= m_x[m_num - 1]) return extrapolation_right(x);

            // Interpolation
            bsearch(m_num, m_x, x, &i);
            return interpolation(x, i);
        }
        return 0.0;
    }